

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psft.c
# Opt level: O0

FT_Error cf2_checkTransform(CF2_Matrix *transform,FT_Fast unitsPerEm)

{
  FT_Long FVar1;
  CF2_F16Dot16 maxScale;
  FT_Fast unitsPerEm_local;
  CF2_Matrix *transform_local;
  
  if ((transform->a < 1) || (transform->d < 1)) {
    transform_local._4_4_ = 0x24;
  }
  else if (unitsPerEm < 0x8000) {
    FVar1 = FT_DivFix(0x7d00000,(long)(unitsPerEm << 0x10));
    if (((int)FVar1 < transform->a) || ((int)FVar1 < transform->d)) {
      transform_local._4_4_ = 0xa4;
    }
    else {
      transform_local._4_4_ = 0;
    }
  }
  else {
    transform_local._4_4_ = 0xa4;
  }
  return transform_local._4_4_;
}

Assistant:

static FT_Error
  cf2_checkTransform( const CF2_Matrix*  transform,
                      CF2_Int            unitsPerEm )
  {
    CF2_Fixed  maxScale;


    if ( transform->a <= 0 || transform->d <= 0 )
      return FT_THROW( Invalid_Size_Handle );

    FT_ASSERT( unitsPerEm > 0 );
    FT_ASSERT( transform->b == 0 && transform->c == 0 );
    FT_ASSERT( transform->tx == 0 && transform->ty == 0 );

    if ( unitsPerEm > 0x7FFF )
      return FT_THROW( Glyph_Too_Big );

    maxScale = FT_DivFix( CF2_MAX_SIZE, cf2_intToFixed( unitsPerEm ) );

    if ( transform->a > maxScale || transform->d > maxScale )
      return FT_THROW( Glyph_Too_Big );

    return FT_Err_Ok;
  }